

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int check_type_properties(uint32_t property)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  iVar1 = -2;
  if (((((((property & 0xf) < 9) && ((0x116U >> (property & 0xf) & 1) != 0)) &&
        ((~property & 0x802) != 0)) &&
       (((property & 0x300) != 0x300 && ((property & 0x500) != 0x500)))) &&
      (((~property & 0x6000) != 0 && (((property & 0x1004) != 4 && ((property & 0x1002) != 0x1002)))
       ))) && (auVar3._0_4_ = -(uint)((property & 0x2800) == 0x2000),
              auVar3._4_4_ = -(uint)((property & 0x2002) == 0x2002),
              auVar3._8_4_ = -(uint)((property & 0x4800) == 0x4800),
              auVar3._12_4_ = -(uint)((property & 0x4002) == 2),
              iVar2 = movmskps(property & 0x500,auVar3), iVar2 == 0 && (property & 0x8004) != 4)) {
    iVar1 = (uint)((property & 0x10100) != 0x100) * 2 + -2;
  }
  return iVar1;
}

Assistant:

int check_type_properties(uint32_t property)
{
    /* K, V, B, W all conflict with each other */
    switch (property & MINISCRIPT_TYPE_MASK) {
    case MINISCRIPT_TYPE_B:
    case MINISCRIPT_TYPE_V:
    case MINISCRIPT_TYPE_K:
    case MINISCRIPT_TYPE_W:
        break;
    default:
        return WALLY_EINVAL;
    }

    if ((property & MINISCRIPT_PROPERTY_Z) && (property & MINISCRIPT_PROPERTY_O))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_N) && (property & MINISCRIPT_PROPERTY_Z))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_D))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_K) && !(property & MINISCRIPT_PROPERTY_U))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_U))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_E) && (property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_E) && !(property & MINISCRIPT_PROPERTY_D))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && (property & MINISCRIPT_PROPERTY_E))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_D) && (property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_V) && !(property & MINISCRIPT_PROPERTY_F))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_TYPE_K) && !(property & MINISCRIPT_PROPERTY_S))
        return WALLY_EINVAL;
    if ((property & MINISCRIPT_PROPERTY_Z) && !(property & MINISCRIPT_PROPERTY_M))
        return WALLY_EINVAL;

    return WALLY_OK;
}